

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::BackgroundRescan(Recycler *this,RescanFlags rescanFlags)

{
  int iVar1;
  undefined4 *puVar2;
  Type pSVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *in_FS_OFFSET;
  
  if (this->isProcessingRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x110b,"(!this->isProcessingRescan)","!this->isProcessingRescan");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  this->isProcessingRescan = true;
  if (Js::Configuration::Global[0x2c156] == '\x01') {
    CCLock::Enter((CCLock *)&this->pendingWriteBarrierBlockMap);
    for (uVar8 = 0; uVar8 < (this->pendingWriteBarrierBlockMap).bucketCount; uVar8 = uVar8 + 1) {
      iVar9 = (this->pendingWriteBarrierBlockMap).buckets[uVar8];
      if (iVar9 != -1) {
        while (iVar9 != -1) {
          pSVar3 = (this->pendingWriteBarrierBlockMap).entries;
          iVar1 = pSVar3[iVar9].
                  super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<void_*,_unsigned_long>.
                  super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                  .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.next;
          RecyclerWriteBarrierManager::WriteBarrier
                    (pSVar3[iVar9].
                     super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<void_*,_unsigned_long>.
                     super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                     .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.key,
                     pSVar3[iVar9].
                     super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<void_*,_unsigned_long>.
                     super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                     .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.value);
          iVar9 = iVar1;
        }
      }
    }
    CCLock::Leave((CCLock *)&this->pendingWriteBarrierBlockMap);
  }
  uVar6 = HeapBlockMap64::Rescan(&this->heapBlockMap,this,(bool)((byte)rescanFlags & 1));
  sVar7 = HeapInfoManager::Rescan(&this->autoHeap,rescanFlags);
  this->backgroundRescanCount = this->backgroundRescanCount + '\x01';
  sVar7 = sVar7 + uVar6;
  if ((((byte)rescanFlags | this->needOOMRescan) & 1) != 0) {
    if (this->needOOMRescan != false) {
      sVar7 = 0xffffffffffffffff;
    }
    this->isProcessingRescan = false;
  }
  return sVar7;
}

Assistant:

size_t
Recycler::BackgroundRescan(RescanFlags rescanFlags)
{
    Assert(!this->isProcessingRescan);

    DebugOnly(this->isProcessingRescan = true);

    GCETW(GC_BACKGROUNDRESCAN_START, (this, backgroundRescanCount));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundRescanPhase);

#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        pendingWriteBarrierBlockMap.LockResize();
        pendingWriteBarrierBlockMap.Map([](void* address, size_t size)
        {
            RecyclerWriteBarrierManager::WriteBarrier(address, size);
        });
        pendingWriteBarrierBlockMap.UnlockResize();
    }
#endif

    size_t rescannedPageCount = heapBlockMap.Rescan(this, ((rescanFlags & RescanFlags_ResetWriteWatch) != 0));

    rescannedPageCount += autoHeap.Rescan(rescanFlags);

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundRescanPhase);
    GCETW(GC_BACKGROUNDRESCAN_STOP, (this, backgroundRescanCount));
    this->backgroundRescanCount++;

    if (!this->NeedOOMRescan())
    {
        if ((rescanFlags & RescanFlags_ResetWriteWatch) != 0)
        {
            DebugOnly(this->isProcessingRescan = false);
        }

        return rescannedPageCount;
    }

    DebugOnly(this->isProcessingRescan = false);

    return Recycler::InvalidScanRootBytes;
}